

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

QMetaEnumBuilder __thiscall
QMetaObjectBuilder::addEnumerator(QMetaObjectBuilder *this,QMetaEnum *prototype)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  QMetaType metaType;
  unsigned_long_long value;
  int index;
  long in_FS_OFFSET;
  QMetaEnumBuilder QVar4;
  optional<unsigned_long_long> oVar5;
  QMetaEnumBuilder QVar6;
  int local_74;
  QArrayDataPointer<char> local_70;
  _Storage<unsigned_long_long,_true> local_58;
  undefined1 local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pcVar3 = QMetaEnum::name(prototype);
  QByteArray::QByteArray((QByteArray *)&local_70,pcVar3,-1);
  QVar4 = addEnumerator(this,(QByteArray *)&local_70);
  local_48._0_8_ = QVar4._mobj;
  local_48._8_4_ = QVar4._index;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
  pcVar3 = QMetaEnum::enumName(prototype);
  QByteArray::QByteArray((QByteArray *)&local_70,pcVar3,-1);
  QMetaEnumBuilder::setEnumName((QMetaEnumBuilder *)local_48,(QByteArray *)&local_70);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
  metaType = QMetaEnum::metaType(prototype);
  QMetaEnumBuilder::setMetaType((QMetaEnumBuilder *)local_48,metaType);
  bVar1 = QMetaEnum::isFlag(prototype);
  QMetaEnumBuilder::setIsFlag((QMetaEnumBuilder *)local_48,bVar1);
  bVar1 = QMetaEnum::isScoped(prototype);
  QMetaEnumBuilder::setIsScoped((QMetaEnumBuilder *)local_48,bVar1);
  iVar2 = QMetaEnum::keyCount(prototype);
  index = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  for (; iVar2 != index; index = index + 1) {
    pcVar3 = QMetaEnum::key(prototype,index);
    QByteArray::QByteArray((QByteArray *)&local_70,pcVar3,-1);
    oVar5 = QMetaEnum::value64(prototype,index);
    local_58._M_value =
         oVar5.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long_long>._M_payload;
    local_50 = oVar5.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long_long>._M_engaged;
    local_74 = 0;
    value = std::optional<unsigned_long_long>::value_or<int>
                      ((optional<unsigned_long_long> *)&local_58,&local_74);
    QMetaEnumBuilder::addKey((QMetaEnumBuilder *)local_48,(QByteArray *)&local_70,value);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
  }
  bVar1 = QMetaEnum::is64Bit(prototype);
  QMetaEnumBuilder::setIs64Bit((QMetaEnumBuilder *)local_48,bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar6._12_4_ = 0;
    QVar6._mobj = (QMetaObjectBuilder *)SUB128(QVar4._0_12_,0);
    QVar6._index = SUB124(QVar4._0_12_,8);
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

QMetaEnumBuilder QMetaObjectBuilder::addEnumerator(const QMetaEnum &prototype)
{
    QMetaEnumBuilder en = addEnumerator(prototype.name());
    en.setEnumName(prototype.enumName());
    en.setMetaType(prototype.metaType());
    en.setIsFlag(prototype.isFlag());
    en.setIsScoped(prototype.isScoped());
    int count = prototype.keyCount();
    for (int index = 0; index < count; ++index)
        en.addKey(prototype.key(index), prototype.value64(index).value_or(0));
    // reset the is64Bit() flag if necessary
    en.setIs64Bit(prototype.is64Bit());
    return en;
}